

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<unsigned_short,std::chrono::duration<long,std::ratio<1l,1000l>>>,2ul>
               (duration<long,_std::ratio<1L,_1000L>_> *t,ostream *param_2)

{
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<unsigned_short,void,std::ostream&>((unsigned_short *)(t + 1),param_2);
  std::operator<<(param_2,", ");
  FallbackPrinter::PrintValue<std::chrono::duration<long,std::ratio<1l,1000l>>>(t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}